

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnRefIsNullExpr(TypeChecker *this)

{
  bool bVar1;
  Enum EVar2;
  undefined8 uVar3;
  char *in_RCX;
  Type local_90;
  Enum local_88;
  Result local_84;
  string local_80;
  undefined1 local_60 [8];
  string message;
  undefined1 local_38 [8];
  TypeVector actual;
  Type type;
  TypeChecker *this_local;
  Result result;
  
  this_local._4_4_ =
       PeekType(this,0,(Type *)&actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
  EVar2 = Type::operator_cast_to_Enum
                    ((Type *)&actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((EVar2 != Any) &&
     (bVar1 = Type::IsRef((Type *)&actual.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage), !bVar1)) {
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_38);
    message.field_2._12_4_ = this_local._4_4_;
    bVar1 = Succeeded(this_local._4_4_);
    if (bVar1) {
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_38,
                 (value_type *)
                 &actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_80,(_anonymous_namespace_ *)local_38,(TypeVector *)0x0,in_RCX);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   "type mismatch in ref.is_null, expected reference but got ",&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    uVar3 = std::__cxx11::string::c_str();
    PrintError(this,"%s",uVar3);
    Result::Result(&local_84,Error);
    this_local._4_4_ = local_84.enum_;
    std::__cxx11::string::~string((string *)local_60);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_38);
  }
  local_88 = (Enum)DropTypes(this,1);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_88);
  Type::Type(&local_90,I32);
  PushType(this,local_90);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnRefIsNullExpr() {
  Type type;
  Result result = PeekType(0, &type);
  if (!(type == Type::Any || type.IsRef())) {
    TypeVector actual;
    if (Succeeded(result)) {
      actual.push_back(type);
    }
    std::string message =
        "type mismatch in ref.is_null, expected reference but got " +
        TypesToString(actual);
    PrintError("%s", message.c_str());
    result = Result::Error;
  }
  result |= DropTypes(1);
  PushType(Type::I32);
  return result;
}